

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxCVar::Emit(FxCVar *this,VMFunctionBuilder *build)

{
  FBaseCVar *pFVar1;
  ExpEmit EVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  FMaskCVar *cv_1;
  FFlagCVar *cv;
  ushort local_28;
  int nul;
  ExpEmit addr;
  VMFunctionBuilder *build_local;
  FxCVar *this_local;
  ExpEmit dest;
  
  addr = (ExpEmit)build;
  iVar3 = PType::GetRegType((this->super_FxExpression).ValueType);
  ExpEmit::ExpEmit((ExpEmit *)&this_local,build,iVar3,1);
  ExpEmit::ExpEmit((ExpEmit *)&stack0xffffffffffffffd8,(VMFunctionBuilder *)addr,3,1);
  uVar4 = VMFunctionBuilder::GetConstantInt((VMFunctionBuilder *)addr,0);
  iVar3 = (*this->CVar->_vptr_FBaseCVar[2])();
  EVar2 = addr;
  switch(iVar3) {
  case 0:
    uVar6 = (uint)local_28;
    uVar5 = VMFunctionBuilder::GetConstantAddress((VMFunctionBuilder *)addr,this->CVar + 1,'\0');
    VMFunctionBuilder::Emit((VMFunctionBuilder *)EVar2,5,uVar6,(VM_SHALF)uVar5);
    VMFunctionBuilder::Emit
              ((VMFunctionBuilder *)addr,0x12,(uint)(ushort)this_local,(uint)local_28,uVar4);
    break;
  case 1:
    uVar6 = (uint)local_28;
    uVar5 = VMFunctionBuilder::GetConstantAddress((VMFunctionBuilder *)addr,this->CVar + 1,'\0');
    VMFunctionBuilder::Emit((VMFunctionBuilder *)EVar2,5,uVar6,(VM_SHALF)uVar5);
    VMFunctionBuilder::Emit
              ((VMFunctionBuilder *)addr,0x10,(uint)(ushort)this_local,(uint)local_28,uVar4);
    break;
  case 2:
    uVar6 = (uint)local_28;
    uVar5 = VMFunctionBuilder::GetConstantAddress((VMFunctionBuilder *)addr,this->CVar + 1,'\0');
    VMFunctionBuilder::Emit((VMFunctionBuilder *)EVar2,5,uVar6,(VM_SHALF)uVar5);
    VMFunctionBuilder::Emit
              ((VMFunctionBuilder *)addr,0x16,(uint)(ushort)this_local,(uint)local_28,uVar4);
    break;
  case 3:
    uVar6 = (uint)local_28;
    uVar5 = VMFunctionBuilder::GetConstantAddress((VMFunctionBuilder *)addr,this->CVar + 1,'\0');
    VMFunctionBuilder::Emit((VMFunctionBuilder *)EVar2,5,uVar6,(VM_SHALF)uVar5);
    VMFunctionBuilder::Emit
              ((VMFunctionBuilder *)addr,0x1a,(uint)(ushort)this_local,(uint)local_28,uVar4);
    break;
  case 4:
    uVar6 = (uint)local_28;
    uVar5 = VMFunctionBuilder::GetConstantAddress((VMFunctionBuilder *)addr,this->CVar + 1,'\0');
    VMFunctionBuilder::Emit((VMFunctionBuilder *)EVar2,5,uVar6,(VM_SHALF)uVar5);
    VMFunctionBuilder::Emit
              ((VMFunctionBuilder *)addr,0x10,(uint)(ushort)this_local,(uint)local_28,uVar4);
    break;
  case 5:
    pFVar1 = this->CVar;
    uVar5 = (uint)local_28;
    uVar6 = VMFunctionBuilder::GetConstantAddress
                      ((VMFunctionBuilder *)addr,pFVar1[1]._vptr_FBaseCVar + 5,'\0');
    VMFunctionBuilder::Emit((VMFunctionBuilder *)EVar2,5,uVar5,(VM_SHALF)uVar6);
    VMFunctionBuilder::Emit
              ((VMFunctionBuilder *)addr,0x10,(uint)(ushort)this_local,(uint)local_28,uVar4);
    VMFunctionBuilder::Emit
              ((VMFunctionBuilder *)addr,0x5e,(uint)(ushort)this_local,(uint)(ushort)this_local,
               *(int *)((long)&pFVar1[1].Name + 4));
    EVar2 = addr;
    uVar4 = (uint)(ushort)this_local;
    uVar5 = (uint)(ushort)this_local;
    uVar6 = VMFunctionBuilder::GetConstantInt((VMFunctionBuilder *)addr,1);
    VMFunctionBuilder::Emit((VMFunctionBuilder *)EVar2,0x78,uVar4,uVar5,uVar6);
    break;
  case 6:
    pFVar1 = this->CVar;
    uVar5 = (uint)local_28;
    uVar6 = VMFunctionBuilder::GetConstantAddress
                      ((VMFunctionBuilder *)addr,pFVar1[1]._vptr_FBaseCVar + 5,'\0');
    VMFunctionBuilder::Emit((VMFunctionBuilder *)EVar2,5,uVar5,(VM_SHALF)uVar6);
    VMFunctionBuilder::Emit
              ((VMFunctionBuilder *)addr,0x10,(uint)(ushort)this_local,(uint)local_28,uVar4);
    EVar2 = addr;
    uVar4 = (uint)(ushort)this_local;
    uVar5 = (uint)(ushort)this_local;
    uVar6 = VMFunctionBuilder::GetConstantInt((VMFunctionBuilder *)addr,*(int *)&pFVar1[1].Name);
    VMFunctionBuilder::Emit((VMFunctionBuilder *)EVar2,0x78,uVar4,uVar5,uVar6);
    VMFunctionBuilder::Emit
              ((VMFunctionBuilder *)addr,0x5e,(uint)(ushort)this_local,(uint)(ushort)this_local,
               *(int *)((long)&pFVar1[1].Name + 4));
    break;
  default:
    __assert_fail("false && \"Unsupported CVar type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x187e,"virtual ExpEmit FxCVar::Emit(VMFunctionBuilder *)");
  }
  ExpEmit::Free((ExpEmit *)&stack0xffffffffffffffd8,(VMFunctionBuilder *)addr);
  EVar2.RegType = this_local._2_1_;
  EVar2.RegCount = this_local._3_1_;
  EVar2.Konst = (bool)this_local._4_1_;
  EVar2.Fixed = (bool)this_local._5_1_;
  EVar2.Final = (bool)this_local._6_1_;
  EVar2.Target = (bool)this_local._7_1_;
  EVar2.RegNum = (ushort)this_local;
  return EVar2;
}

Assistant:

ExpEmit FxCVar::Emit(VMFunctionBuilder *build)
{
	ExpEmit dest(build, ValueType->GetRegType());
	ExpEmit addr(build, REGT_POINTER);
	int nul = build->GetConstantInt(0);
	switch (CVar->GetRealType())
	{
	case CVAR_Int:
		build->Emit(OP_LKP, addr.RegNum, build->GetConstantAddress(&static_cast<FIntCVar *>(CVar)->Value, ATAG_GENERIC));
		build->Emit(OP_LW, dest.RegNum, addr.RegNum, nul);
		break;

	case CVAR_Color:
		build->Emit(OP_LKP, addr.RegNum, build->GetConstantAddress(&static_cast<FColorCVar *>(CVar)->Value, ATAG_GENERIC));
		build->Emit(OP_LW, dest.RegNum, addr.RegNum, nul);
		break;

	case CVAR_Float:
		build->Emit(OP_LKP, addr.RegNum, build->GetConstantAddress(&static_cast<FFloatCVar *>(CVar)->Value, ATAG_GENERIC));
		build->Emit(OP_LSP, dest.RegNum, addr.RegNum, nul);
		break;

	case CVAR_Bool:
		build->Emit(OP_LKP, addr.RegNum, build->GetConstantAddress(&static_cast<FBoolCVar *>(CVar)->Value, ATAG_GENERIC));
		build->Emit(OP_LBU, dest.RegNum, addr.RegNum, nul);
		break;

	case CVAR_String:
		build->Emit(OP_LKP, addr.RegNum, build->GetConstantAddress(&static_cast<FStringCVar *>(CVar)->Value, ATAG_GENERIC));
		build->Emit(OP_LS, dest.RegNum, addr.RegNum, nul);
		break;

	case CVAR_DummyBool:
	{
		auto cv = static_cast<FFlagCVar *>(CVar);
		build->Emit(OP_LKP, addr.RegNum, build->GetConstantAddress(&cv->ValueVar.Value, ATAG_GENERIC));
		build->Emit(OP_LW, dest.RegNum, addr.RegNum, nul);
		build->Emit(OP_SRL_RI, dest.RegNum, dest.RegNum, cv->BitNum);
		build->Emit(OP_AND_RK, dest.RegNum, dest.RegNum, build->GetConstantInt(1));
		break;
	}

	case CVAR_DummyInt:
	{
		auto cv = static_cast<FMaskCVar *>(CVar);
		build->Emit(OP_LKP, addr.RegNum, build->GetConstantAddress(&cv->ValueVar.Value, ATAG_GENERIC));
		build->Emit(OP_LW, dest.RegNum, addr.RegNum, nul);
		build->Emit(OP_AND_RK, dest.RegNum, dest.RegNum, build->GetConstantInt(cv->BitVal));
		build->Emit(OP_SRL_RI, dest.RegNum, dest.RegNum, cv->BitNum);
		break;
	}

	default:
		assert(false && "Unsupported CVar type");
		break;
	}
	addr.Free(build);
	return dest;
}